

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

bool spvtools::opt::analysis::anon_unknown_29::CompareTwoVectors(U32VecVec *a,U32VecVec *b)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer puVar5;
  void *pvVar6;
  undefined8 *puVar7;
  void *pvVar8;
  long lVar9;
  pointer ppvVar10;
  pointer ppvVar11;
  int iVar12;
  ulong uVar13;
  size_t sVar14;
  ulong __n;
  ulong uVar15;
  long lVar16;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  __i;
  pointer ppvVar17;
  void *pvVar18;
  bool bVar19;
  bool bVar20;
  vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  b_ptrs;
  vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  a_ptrs;
  pointer local_80;
  void *local_78;
  void *pvStack_70;
  long local_68;
  vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  local_58;
  pointer local_40;
  pointer local_38;
  
  pvVar1 = (a->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (a->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (b->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)pvVar2 - (long)pvVar1 ==
      (long)(b->
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) {
    __n = ((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555;
    if (__n == 0) {
      return true;
    }
    if (__n != 1) {
      local_58.
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.
      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68 = 0;
      local_78 = (void *)0x0;
      pvStack_70 = (void *)0x0;
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::reserve(&local_58,__n);
      std::
      vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
      ::reserve(&local_58,__n);
      local_40 = pvVar2;
      local_38 = pvVar1;
      if (pvVar2 != pvVar1) {
        uVar13 = 0;
        uVar15 = 1;
        do {
          local_80 = (a->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar13;
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>
                    ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
                      *)&local_58,&local_80);
          local_80 = (b->
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + uVar13;
          std::
          vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
          ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>
                    ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
                      *)&local_78,&local_80);
          bVar19 = uVar15 <= __n;
          lVar9 = __n - uVar15;
          uVar13 = uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar19 && lVar9 != 0);
      }
      ppvVar11 = local_58.
                 super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      ppvVar10 = local_58.
                 super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (local_58.
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_58.
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar16 = (long)local_58.
                       super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        uVar13 = lVar16 >> 3;
        lVar9 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                  (local_58.
                   super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_58.
                   super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar16 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                    (ppvVar10,ppvVar11);
        }
        else {
          ppvVar17 = ppvVar10 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                    (ppvVar10,ppvVar17);
          for (; ppvVar17 != ppvVar11; ppvVar17 = ppvVar17 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,__gnu_cxx::__ops::_Val_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                      (ppvVar17);
          }
        }
      }
      pvVar8 = pvStack_70;
      pvVar6 = local_78;
      if (local_78 != pvStack_70) {
        lVar16 = (long)pvStack_70 - (long)local_78;
        uVar13 = lVar16 >> 3;
        lVar9 = 0x3f;
        if (uVar13 != 0) {
          for (; uVar13 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                  (local_78,pvStack_70,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar16 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                    (pvVar6,pvVar8);
        }
        else {
          pvVar18 = (void *)((long)pvVar6 + 0x80);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                    (pvVar6,pvVar18);
          for (; pvVar18 != pvVar8; pvVar18 = (void *)((long)pvVar18 + 8)) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,__gnu_cxx::__ops::_Val_comp_iter<spvtools::opt::analysis::(anonymous_namespace)::CompareTwoVectors(std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>)::__0>>
                      (pvVar18);
          }
        }
      }
      ppvVar10 = local_58.
                 super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = local_78;
      bVar19 = true;
      if (local_40 != local_38) {
        uVar13 = 0;
        uVar15 = 1;
        do {
          puVar7 = *(undefined8 **)((long)pvVar6 + uVar13 * 8);
          puVar4 = (ppvVar10[uVar13]->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          puVar5 = (ppvVar10[uVar13]->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          sVar14 = (long)puVar5 - (long)puVar4;
          pvVar8 = (void *)*puVar7;
          if ((sVar14 != puVar7[1] - (long)pvVar8) ||
             ((puVar5 != puVar4 && (iVar12 = bcmp(puVar4,pvVar8,sVar14), iVar12 != 0)))) {
            bVar19 = false;
            break;
          }
          bVar20 = uVar15 <= __n;
          lVar9 = __n - uVar15;
          uVar13 = uVar15;
          uVar15 = (ulong)((int)uVar15 + 1);
        } while (bVar20 && lVar9 != 0);
      }
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,local_68 - (long)pvVar6);
      }
      if (local_58.
          super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
        return bVar19;
      }
      operator_delete(local_58.
                      super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
      return bVar19;
    }
    puVar4 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    sVar14 = (long)puVar5 - (long)puVar4;
    pvVar6 = (pvVar3->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar14 == (long)*(pointer *)
                         ((long)&(pvVar3->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + 8) - (long)pvVar6) {
      if (puVar5 == puVar4) {
        return true;
      }
      iVar12 = bcmp(puVar4,pvVar6,sVar14);
      return iVar12 == 0;
    }
  }
  return false;
}

Assistant:

bool CompareTwoVectors(const U32VecVec a, const U32VecVec b) {
  const auto size = a.size();
  if (size != b.size()) return false;

  if (size == 0) return true;
  if (size == 1) return a.front() == b.front();

  std::vector<const std::vector<uint32_t>*> a_ptrs, b_ptrs;
  a_ptrs.reserve(size);
  a_ptrs.reserve(size);
  for (uint32_t i = 0; i < size; ++i) {
    a_ptrs.push_back(&a[i]);
    b_ptrs.push_back(&b[i]);
  }

  const auto cmp = [](const std::vector<uint32_t>* m,
                      const std::vector<uint32_t>* n) {
    return m->front() < n->front();
  };

  std::sort(a_ptrs.begin(), a_ptrs.end(), cmp);
  std::sort(b_ptrs.begin(), b_ptrs.end(), cmp);

  for (uint32_t i = 0; i < size; ++i) {
    if (*a_ptrs[i] != *b_ptrs[i]) return false;
  }
  return true;
}